

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O2

void * mwRealloc(void *p,size_t size,char *file,int line)

{
  mwData *mw;
  char cVar1;
  int iVar2;
  long lVar3;
  void *pvVar4;
  mwData *pmVar5;
  void *__dest;
  long lVar6;
  undefined4 *puVar7;
  
  mwAutoInit();
  if (p == (void *)0x0) {
    pvVar4 = mwMalloc(size,file,line);
    return pvVar4;
  }
  if (size == 0) {
    mwFree(p,file,line);
    return (void *)0x0;
  }
  pvVar4 = (void *)((long)p + -0x38);
  if (mwDataSize == '\0') {
    pvVar4 = p;
  }
  mw = (mwData *)((long)pvVar4 + -8);
  iVar2 = mwIsOwned(mw,file,line);
  cVar1 = mwUseLimit;
  if (iVar2 != 0) {
    if ((*(byte *)((long)pvVar4 + 0x2c) & 1) == 0) {
      if ((mwUseLimit != '\x01') ||
         (lVar3 = *(long *)((long)pvVar4 + 0x20),
         (long)((mwStatCurAlloc + size) - lVar3) <= mwAllocLimit)) {
        mwUseLimit = 0;
        __dest = mwMalloc(size,file,line);
        if (__dest == (void *)0x0) {
          mwUseLimit = cVar1;
          return (void *)0x0;
        }
        if (*(ulong *)((long)pvVar4 + 0x20) < size) {
          size = *(ulong *)((long)pvVar4 + 0x20);
        }
        memcpy(__dest,p,size);
        mwFree(p,file,line);
        mwUseLimit = cVar1;
        return __dest;
      }
      if (mwTestAlways != 0) {
        mwTestNow(file,line,1);
        lVar3 = *(long *)((long)pvVar4 + 0x20);
      }
      mwCounter = mwCounter + 1;
      mwWrite("limit fail: <%ld> %s(%d), %ld wanted %ld available\n",mwCounter,file,
              (ulong)(uint)line,size - lVar3,mwAllocLimit - mwStatCurAlloc);
      mwIncErr();
      goto LAB_001075a9;
    }
    mwIncErr();
    pmVar5 = (mwData *)((long)pvVar4 + 0x30);
    if (mwDataSize == '\0') {
      pmVar5 = mw;
    }
    if (*(char *)&pmVar5->next != -4) {
      mwWrite("internal: <%ld> %s(%d), no-mans-land MW-%p is corrupted\n",mwCounter,file,
              (ulong)(uint)line,mw);
    }
  }
  puVar7 = (undefined4 *)((long)mwLFfile + 0x1fc);
  lVar3 = 0;
  do {
    lVar6 = lVar3;
    if (lVar6 == 0x200) {
      mwIncErr();
      mwWrite("realloc: <%ld> %s(%d), unknown pointer %p\n",mwCounter,file,(ulong)(uint)line,p);
      goto LAB_001075a9;
    }
    puVar7 = puVar7 + 1;
    lVar3 = lVar6 + 8;
  } while (*(void **)((long)mwLastFree + lVar6) != p);
  mwIncErr();
  mwWrite("realloc: <%ld> %s(%d), %p was freed from %s(%d)\n",mwCounter,file,(ulong)(uint)line,p,
          *(undefined8 *)((long)mwLFfile + lVar6),*puVar7);
LAB_001075a9:
  mwFlush();
  return (void *)0x0;
}

Assistant:

void *mwRealloc(void *p, size_t size, const char *file, int line)
{
	int oldUseLimit, i;
	mwData *mw;
	char *ptr;

	mwAutoInit();

	if (p == NULL) {
		return mwMalloc(size, file, line);
	}
	if (size == 0) {
		mwFree(p, file, line);
		return NULL;
	}

	MW_MUTEX_LOCK();

	/* do the quick ownership test */
	mw = (mwData *) mwBUFFER_TO_MW(p);
	if (mwIsOwned(mw, file, line)) {

		/* if the buffer is an NML, treat this as a double-free */
		if (mw->flag & MW_NML) {
			mwIncErr();
			if (*((unsigned char *)(mw) + mwDataSize + mwOverflowZoneSize) != MW_VAL_NML) {
				mwWrite("internal: <%ld> %s(%d), no-mans-land MW-%p is corrupted\n",
						mwCounter, file, line, mw);
			}
			goto check_dbl_free;
		}

		/* if this allocation would violate the limit, fail it */
		if (mwUseLimit && ((long)size + mwStatCurAlloc - (long)mw->size > mwAllocLimit)) {
			TESTS(file, line);
			mwCounter ++;
			mwWrite("limit fail: <%ld> %s(%d), %ld wanted %ld available\n",
					mwCounter, file, line, (unsigned long)size - mw->size, mwAllocLimit - mwStatCurAlloc);
			mwIncErr();
			FLUSH();
			MW_MUTEX_UNLOCK();
			return NULL;
		}

		/* fake realloc operation */
		oldUseLimit = mwUseLimit;
		mwUseLimit = 0;
		ptr = (char *) mwMalloc(size, file, line);
		if (ptr != NULL) {
			if (size < mw->size) {
				memcpy(ptr, p, size);
			} else {
				memcpy(ptr, p, mw->size);
			}
			mwFree(p, file, line);
		}
		mwUseLimit = oldUseLimit;
		MW_MUTEX_UNLOCK();
		return (void *) ptr;
	}

	/* Unknown pointer! */

	/* using free'd pointer? */
check_dbl_free:
	for (i = 0; i < MW_FREE_LIST; i++) {
		if (mwLastFree[i] == p) {
			mwIncErr();
			mwWrite("realloc: <%ld> %s(%d), %p was"
					" freed from %s(%d)\n",
					mwCounter, file, line, p,
					mwLFfile[i], mwLFline[i]);
			FLUSH();
			MW_MUTEX_UNLOCK();
			return NULL;
		}
	}

	/* some weird pointer */
	mwIncErr();
	mwWrite("realloc: <%ld> %s(%d), unknown pointer %p\n",
			mwCounter, file, line, p);
	FLUSH();
	MW_MUTEX_UNLOCK();
	return NULL;
}